

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

QString * __thiscall QFileInfo::group(QString *__return_storage_ptr__,QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  
  this_00 = (this->d_ptr).d.ptr;
  if ((this_00->field_0x1db & 0x40) == 0) {
    QFileInfoPrivate::getFileOwner(__return_storage_ptr__,this_00,OwnerGroup);
  }
  else {
    QString::QString(__return_storage_ptr__,(QLatin1StringView)(ZEXT816(0x46f2d9) << 0x40));
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileInfo::group() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    return d->getFileOwner(QAbstractFileEngine::OwnerGroup);
}